

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O2

void BrotliCreateZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,BrotliEncoderParams *params,HasherHandle hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals)

{
  int iVar1;
  ZopfliNode *array;
  size_t sVar2;
  size_t max_backward_limit;
  
  iVar1 = params->lgwin;
  sVar2 = num_bytes + 1;
  if (sVar2 == 0) {
    array = (ZopfliNode *)0x0;
  }
  else {
    array = (ZopfliNode *)BrotliAllocate(m,sVar2 * 0x10);
  }
  max_backward_limit = (1L << ((byte)iVar1 & 0x3f)) - 0x10;
  BrotliInitZopfliNodes(array,sVar2);
  sVar2 = BrotliZopfliComputeShortestPath
                    (m,num_bytes,position,ringbuffer,ringbuffer_mask,params,max_backward_limit,
                     dist_cache,hasher,array);
  *num_commands = *num_commands + sVar2;
  BrotliZopfliCreateCommands
            (num_bytes,position,max_backward_limit,array,dist_cache,last_insert_len,params,commands,
             num_literals);
  BrotliFree(m,array);
  return;
}

Assistant:

void BrotliCreateZopfliBackwardReferences(MemoryManager* m,
    size_t num_bytes, size_t position, const uint8_t* ringbuffer,
    size_t ringbuffer_mask, const BrotliEncoderParams* params,
    HasherHandle hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  ZopfliNode* nodes;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m)) return;
  BrotliInitZopfliNodes(nodes, num_bytes + 1);
  *num_commands += BrotliZopfliComputeShortestPath(m,
      num_bytes, position, ringbuffer, ringbuffer_mask,
      params, max_backward_limit, dist_cache, hasher, nodes);
  if (BROTLI_IS_OOM(m)) return;
  BrotliZopfliCreateCommands(num_bytes, position, max_backward_limit, nodes,
      dist_cache, last_insert_len, params, commands, num_literals);
  BROTLI_FREE(m, nodes);
}